

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O1

void replace_dollar_number_with_list(List *code,int field,List *list)

{
  ListStruct *pLVar1;
  ListStruct *pLVar2;
  anon_union_8_7_0ba269be_for_u aVar3;
  char *pcVar4;
  unsigned_long uVar5;
  TokenType TVar6;
  undefined4 uVar7;
  List *pLVar8;
  
  for (; code != (List *)0x0; code = code->cdr) {
    if (((code->token).type == TOK_DOLLAR_NUMBER) && ((uint)(code->token).u.reginfo.which == field))
    {
      pLVar8 = copy_list(list);
      pLVar1 = code->cdr;
      pLVar2 = pLVar8->car;
      TVar6 = (pLVar8->token).type;
      uVar7 = *(undefined4 *)&(pLVar8->token).field_0x4;
      aVar3 = (pLVar8->token).u;
      pcVar4 = (pLVar8->token).filename;
      uVar5 = (pLVar8->token).lineno;
      code->cdr = pLVar8->cdr;
      code->car = pLVar2;
      (code->token).type = TVar6;
      *(undefined4 *)&(code->token).field_0x4 = uVar7;
      (code->token).u = aVar3;
      (code->token).filename = pcVar4;
      (code->token).lineno = uVar5;
      code->cdr = pLVar1;
    }
    else {
      replace_dollar_number_with_list(code->car,field,list);
    }
  }
  return;
}

Assistant:

static void
replace_dollar_number_with_list (List *code, int field, List *list)
{
  if (code == NULL)
    return;

  if (code->token.type == TOK_DOLLAR_NUMBER
      && code->token.u.dollarinfo.which == field)
    {
      List *new = copy_list (list);
      List *old_cdr = code->cdr;

      *code = *new;
      code->cdr = old_cdr;
    }
  else
    replace_dollar_number_with_list (code->car, field, list);
  replace_dollar_number_with_list (code->cdr, field, list);
}